

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_Select_Metrics(FT_Face face,FT_ULong strike_index)

{
  FT_Size pFVar1;
  FT_Bitmap_Size *pFVar2;
  FT_Long FVar3;
  FT_Bitmap_Size *bsize;
  FT_Size_Metrics *metrics;
  FT_ULong strike_index_local;
  FT_Face face_local;
  
  pFVar1 = face->size;
  pFVar2 = face->available_sizes + strike_index;
  (pFVar1->metrics).x_ppem = (FT_UShort)(pFVar2->x_ppem + 0x20 >> 6);
  (pFVar1->metrics).y_ppem = (FT_UShort)(pFVar2->y_ppem + 0x20 >> 6);
  if ((face->face_flags & 1U) == 0) {
    (pFVar1->metrics).x_scale = 0x10000;
    (pFVar1->metrics).y_scale = 0x10000;
    (pFVar1->metrics).ascender = pFVar2->y_ppem;
    (pFVar1->metrics).descender = 0;
    (pFVar1->metrics).height = (long)((int)pFVar2->height << 6);
    (pFVar1->metrics).max_advance = pFVar2->x_ppem;
  }
  else {
    FVar3 = FT_DivFix(pFVar2->x_ppem,(ulong)face->units_per_EM);
    (pFVar1->metrics).x_scale = FVar3;
    FVar3 = FT_DivFix(pFVar2->y_ppem,(ulong)face->units_per_EM);
    (pFVar1->metrics).y_scale = FVar3;
    ft_recompute_scaled_metrics(face,&pFVar1->metrics);
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Select_Metrics( FT_Face   face,
                     FT_ULong  strike_index )
  {
    FT_Size_Metrics*  metrics;
    FT_Bitmap_Size*   bsize;


    metrics = &face->size->metrics;
    bsize   = face->available_sizes + strike_index;

    metrics->x_ppem = (FT_UShort)( ( bsize->x_ppem + 32 ) >> 6 );
    metrics->y_ppem = (FT_UShort)( ( bsize->y_ppem + 32 ) >> 6 );

    if ( FT_IS_SCALABLE( face ) )
    {
      metrics->x_scale = FT_DivFix( bsize->x_ppem,
                                    face->units_per_EM );
      metrics->y_scale = FT_DivFix( bsize->y_ppem,
                                    face->units_per_EM );

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      metrics->x_scale     = 1L << 16;
      metrics->y_scale     = 1L << 16;
      metrics->ascender    = bsize->y_ppem;
      metrics->descender   = 0;
      metrics->height      = bsize->height << 6;
      metrics->max_advance = bsize->x_ppem;
    }
  }